

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::ExpectationBase::ExpectationBase
          (ExpectationBase *this,char *a_file,int a_line,string *a_source_text)

{
  string *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_stack_ffffffffffffffa8;
  int n;
  
  n = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  *in_RDI = &PTR__ExpectationBase_0016c138;
  in_RDI[1] = in_RSI;
  *(undefined4 *)(in_RDI + 2) = in_EDX;
  std::__cxx11::string::string((string *)(in_RDI + 3),in_RCX);
  *(undefined1 *)(in_RDI + 7) = 0;
  Exactly(n);
  ExpectationSet::ExpectationSet((ExpectationSet *)0x12754f);
  *(undefined4 *)(in_RDI + 0x10) = 0;
  *(undefined1 *)((long)in_RDI + 0x84) = 0;
  std::vector<const_void_*,_std::allocator<const_void_*>_>::vector
            ((vector<const_void_*,_std::allocator<const_void_*>_> *)0x127577);
  *(undefined1 *)(in_RDI + 0x14) = 0;
  *(undefined1 *)((long)in_RDI + 0xa1) = 0;
  *(undefined1 *)((long)in_RDI + 0xa2) = 0;
  *(undefined4 *)((long)in_RDI + 0xa4) = 0;
  *(undefined1 *)(in_RDI + 0x15) = 0;
  Mutex::Mutex((Mutex *)in_RCX);
  return;
}

Assistant:

ExpectationBase::ExpectationBase(const char* a_file,
                                 int a_line,
                                 const string& a_source_text)
    : file_(a_file),
      line_(a_line),
      source_text_(a_source_text),
      cardinality_specified_(false),
      cardinality_(Exactly(1)),
      call_count_(0),
      retired_(false),
      extra_matcher_specified_(false),
      repeated_action_specified_(false),
      retires_on_saturation_(false),
      last_clause_(kNone),
      action_count_checked_(false) {}